

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_stack.c
# Opt level: O3

DS_STATUS ds_stack_pop(DsStack *stack,void **data)

{
  DS_STATUS DVar1;
  uint uVar2;
  
  if (stack == (DsStack *)0x0) {
    DVar1 = DS_STATUS_NULL;
  }
  else {
    if (stack->index < 1) {
      return DS_STATUS_EMPTY;
    }
    DVar1 = DS_STATUS_OK;
    if (data != (void **)0x0) {
      uVar2 = stack->index - 1;
      stack->index = uVar2;
      *data = stack->elems[uVar2];
      return DS_STATUS_OK;
    }
  }
  return DVar1;
}

Assistant:

DS_STATUS ds_stack_pop(DsStack *stack, void **data)
{
    if (NULL == stack)
        return DS_STATUS_NULL;
    if (stack->index <= 0)
        return DS_STATUS_EMPTY;
    if (data)
        *data = stack->elems[--stack->index];
    return DS_STATUS_OK;
}